

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_211787::AlsaCapture::open(AlsaCapture *this,char *__file,int __oflag,...)

{
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  __last;
  bool bVar1;
  uint uVar2;
  ALuint AVar3;
  int iVar4;
  int extraout_EAX;
  backend_exception *pbVar5;
  pointer p_Var6;
  undefined8 uVar7;
  HwParamsPtr hp;
  bool needring;
  snd_pcm_uframes_t periodSizeInFrames;
  snd_pcm_uframes_t bufferSizeInFrames;
  snd_pcm_format_t format;
  int err;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  iter;
  char *driver;
  snd_pcm_stream_t in_stack_0000026c;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  *in_stack_fffffffffffffdb8;
  ALCdevice *in_stack_fffffffffffffdc0;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  *in_stack_fffffffffffffdc8;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  *in_stack_fffffffffffffdd0;
  anon_class_8_1_898f2789_for__M_pred in_stack_fffffffffffffdd8;
  code *pcVar8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_fffffffffffffde8;
  code *pcVar9;
  int limit_writes;
  undefined4 in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  snd_pcm_t *psVar10;
  char *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  ulong local_80;
  ulong local_78;
  undefined4 local_6c;
  int local_68;
  DevMap *local_58;
  char *local_50;
  DevMap *local_48;
  DevMap *local_40;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  local_38 [4];
  char *local_18;
  char *local_10;
  AlsaCapture *local_8;
  
  local_18 = (char *)0x0;
  local_8 = this;
  if (__file == (char *)0x0) {
    local_10 = "ALSA Default";
    local_18 = GetConfigValue((char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                              in_stack_fffffffffffffe40);
  }
  else {
    local_10 = __file;
    bVar1 = std::
            vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            ::empty(in_stack_fffffffffffffdd0);
    if (bVar1) {
      probe_devices(in_stack_0000026c);
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::~vector(in_stack_fffffffffffffdd0);
    }
    local_40 = (DevMap *)
               std::
               vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               ::cbegin(in_stack_fffffffffffffdb8);
    local_48 = (DevMap *)
               std::
               vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               ::cend(in_stack_fffffffffffffdb8);
    local_50 = local_10;
    __last._M_current._4_4_ = in_stack_fffffffffffffde4;
    __last._M_current._0_4_ = in_stack_fffffffffffffde0;
    local_38[0] = std::
                  find_if<__gnu_cxx::__normal_iterator<(anonymous_namespace)::DevMap_const*,std::vector<(anonymous_namespace)::DevMap,al::allocator<(anonymous_namespace)::DevMap,8ul>>>,(anonymous_namespace)::AlsaCapture::open(char_const*)::__0>
                            (in_stack_fffffffffffffde8,__last,in_stack_fffffffffffffdd8);
    local_58 = (DevMap *)
               std::
               vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               ::cend(in_stack_fffffffffffffdb8);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
                        *)in_stack_fffffffffffffdc0,
                       (__normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
                        *)in_stack_fffffffffffffdb8);
    if (bVar1) {
      pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception
                (pbVar5,0xa004,"Device name \"%s\" not found",local_10);
      __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
    __gnu_cxx::
    __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
    ::operator->(local_38);
    local_18 = (char *)std::__cxx11::string::c_str();
  }
  if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Opening device \"%s\"\n",local_18);
  }
  local_68 = (*(anonymous_namespace)::psnd_pcm_open)(&this->mPcmHandle,local_18,1);
  if (local_68 < 0) {
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception
              (pbVar5,0xa005,"Could not open ALSA device \"%s\"",local_18);
    __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  (*(anonymous_namespace)::psnd_config_update_free_global)();
  local_6c = 0xffffffff;
  switch(((this->super_BackendBase).mDevice)->FmtType) {
  case DevFmtByte:
    local_6c = 0;
    break;
  case DevFmtUByte:
    local_6c = 1;
    break;
  case DevFmtShort:
    local_6c = 2;
    break;
  case DevFmtUShort:
    local_6c = 4;
    break;
  case DevFmtInt:
    local_6c = 10;
    break;
  case DevFmtUInt:
    local_6c = 0xc;
    break;
  case DevFmtFloat:
    local_6c = 0xe;
  }
  uVar2 = maxu(((this->super_BackendBase).mDevice)->BufferSize,
               (((this->super_BackendBase).mDevice)->Frequency * 100) / 1000);
  local_78 = (ulong)uVar2;
  uVar2 = minu(((this->super_BackendBase).mDevice)->BufferSize,
               (((this->super_BackendBase).mDevice)->Frequency * 0x19) / 1000);
  local_80 = (ulong)uVar2;
  bVar1 = false;
  CreateHwParams();
  pcVar8 = (anonymous_namespace)::psnd_pcm_hw_params_any;
  psVar10 = this->mPcmHandle;
  p_Var6 = std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::get
                     ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                      in_stack_fffffffffffffdc0);
  local_68 = (*pcVar8)(psVar10,p_Var6);
  pcVar8 = (anonymous_namespace)::psnd_pcm_hw_params_set_access;
  if (local_68 < 0) {
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_68);
    al::backend_exception::backend_exception
              (pbVar5,0xa004,"snd_pcm_hw_params_any(mPcmHandle, hp.get()) failed: %s",uVar7);
    __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  psVar10 = this->mPcmHandle;
  p_Var6 = std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::get
                     ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                      in_stack_fffffffffffffdc0);
  local_68 = (*pcVar8)(psVar10,p_Var6,3);
  pcVar8 = (anonymous_namespace)::psnd_pcm_hw_params_set_format;
  if (local_68 < 0) {
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_68);
    al::backend_exception::backend_exception
              (pbVar5,0xa004,
               "snd_pcm_hw_params_set_access(mPcmHandle, hp.get(), SND_PCM_ACCESS_RW_INTERLEAVED) failed: %s"
               ,uVar7);
    __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  psVar10 = this->mPcmHandle;
  p_Var6 = std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::get
                     ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                      in_stack_fffffffffffffdc0);
  local_68 = (*pcVar8)(psVar10,p_Var6,local_6c);
  pcVar8 = (anonymous_namespace)::psnd_pcm_hw_params_set_channels;
  if (-1 < local_68) {
    psVar10 = this->mPcmHandle;
    p_Var6 = std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::get
                       ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                        in_stack_fffffffffffffdc0);
    AVar3 = ALCdevice::channelsFromFmt((ALCdevice *)0x2338fa);
    local_68 = (*pcVar8)(psVar10,p_Var6,AVar3);
    pcVar8 = (anonymous_namespace)::psnd_pcm_hw_params_set_rate;
    if (local_68 < 0) {
      pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
      uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_68);
      al::backend_exception::backend_exception
                (pbVar5,0xa004,
                 "snd_pcm_hw_params_set_channels(mPcmHandle, hp.get(), mDevice->channelsFromFmt()) failed: %s"
                 ,uVar7);
      __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
    psVar10 = this->mPcmHandle;
    p_Var6 = std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::get
                       ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                        in_stack_fffffffffffffdc0);
    local_68 = (*pcVar8)(psVar10,p_Var6,((this->super_BackendBase).mDevice)->Frequency,0);
    pcVar8 = (anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_min;
    if (local_68 < 0) {
      pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
      uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_68);
      al::backend_exception::backend_exception
                (pbVar5,0xa004,
                 "snd_pcm_hw_params_set_rate(mPcmHandle, hp.get(), mDevice->Frequency, 0) failed: %s"
                 ,uVar7);
      __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
    psVar10 = this->mPcmHandle;
    p_Var6 = std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::get
                       ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                        in_stack_fffffffffffffdc0);
    iVar4 = (*pcVar8)(psVar10,p_Var6,&local_78);
    if (iVar4 < 0) {
      if (2 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (II) Buffer too large, using intermediate ring buffer\n")
        ;
      }
      bVar1 = true;
      psVar10 = this->mPcmHandle;
      pcVar8 = (anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_near;
      p_Var6 = std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::get
                         ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                          in_stack_fffffffffffffdc0);
      local_68 = (*pcVar8)(psVar10,p_Var6,&local_78);
      if (local_68 < 0) {
        pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
        uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_68);
        al::backend_exception::backend_exception
                  (pbVar5,0xa004,
                   "snd_pcm_hw_params_set_buffer_size_near(mPcmHandle, hp.get(), &bufferSizeInFrames) failed: %s"
                   ,uVar7);
        __cxa_throw(pbVar5,&al::backend_exception::typeinfo,
                    al::backend_exception::~backend_exception);
      }
    }
    psVar10 = this->mPcmHandle;
    pcVar9 = (anonymous_namespace)::psnd_pcm_hw_params_set_period_size_near;
    p_Var6 = std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::get
                       ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                        in_stack_fffffffffffffdc0);
    iVar4 = (*pcVar9)(psVar10,p_Var6,&local_80,0);
    pcVar8 = (anonymous_namespace)::psnd_pcm_hw_params;
    limit_writes = (int)((ulong)pcVar9 >> 0x20);
    local_68 = iVar4;
    if (iVar4 < 0) {
      pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
      uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_68);
      al::backend_exception::backend_exception
                (pbVar5,0xa004,
                 "snd_pcm_hw_params_set_period_size_near(mPcmHandle, hp.get(), &periodSizeInFrames, nullptr) failed: %s"
                 ,uVar7);
      __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
    psVar10 = this->mPcmHandle;
    p_Var6 = std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::get
                       ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                        in_stack_fffffffffffffdc0);
    local_68 = (*pcVar8)(psVar10,p_Var6);
    if (-1 < local_68) {
      pcVar8 = (anonymous_namespace)::psnd_pcm_hw_params_get_period_size;
      p_Var6 = std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::get
                         ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                          in_stack_fffffffffffffdc0);
      local_68 = (*pcVar8)(p_Var6,&local_80,0);
      if (-1 < local_68) {
        std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::operator=
                  ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                   in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        if (bVar1) {
          in_stack_fffffffffffffdc0 =
               (ALCdevice *)(ulong)((this->super_BackendBase).mDevice)->BufferSize;
          ALCdevice::frameSizeFromFmt(in_stack_fffffffffffffdc0);
          RingBuffer::Create(in_stack_fffffffffffffe38,CONCAT44(iVar4,in_stack_fffffffffffffe30),
                             limit_writes);
          std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator=
                    ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)
                     in_stack_fffffffffffffdc0,
                     (unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)
                     in_stack_fffffffffffffdb8);
          std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::~unique_ptr
                    ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)
                     in_stack_fffffffffffffdc0);
        }
        std::__cxx11::string::operator=
                  ((string *)&((this->super_BackendBase).mDevice)->DeviceName,local_10);
        std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::~unique_ptr
                  ((unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter> *)
                   in_stack_fffffffffffffdc0);
        return extraout_EAX;
      }
      pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
      uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_68);
      al::backend_exception::backend_exception
                (pbVar5,0xa004,
                 "snd_pcm_hw_params_get_period_size(hp.get(), &periodSizeInFrames, nullptr) failed: %s"
                 ,uVar7);
      __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_68);
    al::backend_exception::backend_exception
              (pbVar5,0xa004,"snd_pcm_hw_params(mPcmHandle, hp.get()) failed: %s",uVar7);
    __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
  uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_68);
  al::backend_exception::backend_exception
            (pbVar5,0xa004,"snd_pcm_hw_params_set_format(mPcmHandle, hp.get(), format) failed: %s",
             uVar7);
  __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
}

Assistant:

void AlsaCapture::open(const ALCchar *name)
{
    const char *driver{};
    if(name)
    {
        if(CaptureDevices.empty())
            CaptureDevices = probe_devices(SND_PCM_STREAM_CAPTURE);

        auto iter = std::find_if(CaptureDevices.cbegin(), CaptureDevices.cend(),
            [name](const DevMap &entry) -> bool
            { return entry.name == name; }
        );
        if(iter == CaptureDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        driver = iter->device_name.c_str();
    }
    else
    {
        name = alsaDevice;
        driver = GetConfigValue(nullptr, "alsa", "capture", "default");
    }

    TRACE("Opening device \"%s\"\n", driver);
    int err{snd_pcm_open(&mPcmHandle, driver, SND_PCM_STREAM_CAPTURE, SND_PCM_NONBLOCK)};
    if(err < 0)
        throw al::backend_exception{ALC_OUT_OF_MEMORY, "Could not open ALSA device \"%s\"",
            driver};

    /* Free alsa's global config tree. Otherwise valgrind reports a ton of leaks. */
    snd_config_update_free_global();

    snd_pcm_format_t format{SND_PCM_FORMAT_UNKNOWN};
    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        format = SND_PCM_FORMAT_S8;
        break;
    case DevFmtUByte:
        format = SND_PCM_FORMAT_U8;
        break;
    case DevFmtShort:
        format = SND_PCM_FORMAT_S16;
        break;
    case DevFmtUShort:
        format = SND_PCM_FORMAT_U16;
        break;
    case DevFmtInt:
        format = SND_PCM_FORMAT_S32;
        break;
    case DevFmtUInt:
        format = SND_PCM_FORMAT_U32;
        break;
    case DevFmtFloat:
        format = SND_PCM_FORMAT_FLOAT;
        break;
    }

    snd_pcm_uframes_t bufferSizeInFrames{maxu(mDevice->BufferSize, 100*mDevice->Frequency/1000)};
    snd_pcm_uframes_t periodSizeInFrames{minu(mDevice->BufferSize, 25*mDevice->Frequency/1000)};

    bool needring{false};
    HwParamsPtr hp{CreateHwParams()};
#define CHECK(x) do {                                                         \
    if((err=(x)) < 0)                                                         \
        throw al::backend_exception{ALC_INVALID_VALUE, #x " failed: %s", snd_strerror(err)}; \
} while(0)
    CHECK(snd_pcm_hw_params_any(mPcmHandle, hp.get()));
    /* set interleaved access */
    CHECK(snd_pcm_hw_params_set_access(mPcmHandle, hp.get(), SND_PCM_ACCESS_RW_INTERLEAVED));
    /* set format (implicitly sets sample bits) */
    CHECK(snd_pcm_hw_params_set_format(mPcmHandle, hp.get(), format));
    /* set channels (implicitly sets frame bits) */
    CHECK(snd_pcm_hw_params_set_channels(mPcmHandle, hp.get(), mDevice->channelsFromFmt()));
    /* set rate (implicitly constrains period/buffer parameters) */
    CHECK(snd_pcm_hw_params_set_rate(mPcmHandle, hp.get(), mDevice->Frequency, 0));
    /* set buffer size in frame units (implicitly sets period size/bytes/time and buffer time/bytes) */
    if(snd_pcm_hw_params_set_buffer_size_min(mPcmHandle, hp.get(), &bufferSizeInFrames) < 0)
    {
        TRACE("Buffer too large, using intermediate ring buffer\n");
        needring = true;
        CHECK(snd_pcm_hw_params_set_buffer_size_near(mPcmHandle, hp.get(), &bufferSizeInFrames));
    }
    /* set buffer size in frame units (implicitly sets period size/bytes/time and buffer time/bytes) */
    CHECK(snd_pcm_hw_params_set_period_size_near(mPcmHandle, hp.get(), &periodSizeInFrames, nullptr));
    /* install and prepare hardware configuration */
    CHECK(snd_pcm_hw_params(mPcmHandle, hp.get()));
    /* retrieve configuration info */
    CHECK(snd_pcm_hw_params_get_period_size(hp.get(), &periodSizeInFrames, nullptr));
#undef CHECK
    hp = nullptr;

    if(needring)
        mRing = RingBuffer::Create(mDevice->BufferSize, mDevice->frameSizeFromFmt(), false);

    mDevice->DeviceName = name;
}